

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_unittest.cc
# Opt level: O3

AssertionResult __thiscall
anon_unknown.dwarf_4fa71::IsEqual
          (anon_unknown_dwarf_4fa71 *this,char *test_data,uint32_t digest,char *test_result)

{
  uint *puVar1;
  long lVar2;
  int iVar3;
  AssertionResult *pAVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar7;
  string output;
  char *local_1c8;
  char *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  AssertionResult local_198;
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar6
  ;
  
  local_1c8 = test_result;
  local_1c0 = test_data;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  lVar2 = *(long *)(local_198._0_8_ + -0x18);
  if (acStack_b8[lVar2 + 1] == '\0') {
    std::ios::widen((char)&local_1c8 + (char)lVar2 + '0');
    acStack_b8[lVar2 + 1] = '\x01';
  }
  acStack_b8[lVar2] = '0';
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198._0_8_ + -0x18)) = 8;
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198._0_8_ + -0x18));
  *puVar1 = *puVar1 | 0x200;
  *(uint *)((long)auStack_180 + *(long *)(local_198._0_8_ + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198._0_8_ + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  iVar3 = strcmp(local_1b8._M_dataplus._M_p,test_result);
  if (iVar3 == 0) {
    AVar7 = testing::AssertionSuccess();
    sVar6 = AVar7.message_.ptr_;
  }
  else {
    testing::AssertionFailure();
    pAVar4 = testing::AssertionResult::operator<<(&local_198,(char (*) [10])"hash of \"");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_1c0);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [14])"\" incorrect:\n");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [2])"\t");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_1b8);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [11])" returned\n");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [2])"\t");
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,&local_1c8);
    pAVar4 = testing::AssertionResult::operator<<(pAVar4,(char (*) [13])" is correct\n");
    testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_198.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar6.ptr_ = extraout_RDX;
  }
  paVar5 = &local_1b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar5) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    paVar5 = extraout_RAX;
    sVar6.ptr_ = extraout_RDX_00;
  }
  AVar7.message_.ptr_ = sVar6.ptr_;
  AVar7._0_8_ = paVar5;
  return AVar7;
}

Assistant:

::testing::AssertionResult IsEqual(const char *test_data,
                                   uint32_t digest,
                                   const char *test_result) {
  std::string output = digest_to_hex(digest);
  if (strcmp(output.c_str(), test_result) == 0) {
    return ::testing::AssertionSuccess();
  } else {
    return ::testing::AssertionFailure()
        << "hash of \"" << test_data << "\" incorrect:\n"
        << "\t" << output << " returned\n"
        << "\t" << test_result << " is correct\n";
  }
}